

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_6::convertToXdr
               (Data *ofd,char *lineBuffer,int lineBufferMinY,int lineBufferMaxY,int inSize)

{
  int iVar1;
  char *numPixels;
  size_type sVar2;
  uint *puVar3;
  int in_ECX;
  int in_EDX;
  Array *in_RSI;
  long in_RDI;
  PixelType in_R8D;
  int xSampleCount;
  OutSliceInfo_conflict *slice;
  uint i;
  char *readPtr;
  int y;
  char *writePtr;
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_3c;
  int local_2c;
  int iVar4;
  
  local_2c = in_EDX;
  numPixels = Array::operator_cast_to_char_(in_RSI);
  iVar4 = local_2c;
  for (; local_2c <= in_ECX; local_2c = local_2c + 1) {
    for (local_3c = 0;
        sVar2 = std::
                vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                ::size((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                        *)(in_RDI + 0x108)), local_3c < sVar2; local_3c = local_3c + 1) {
      std::
      vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
      ::operator[]((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                    *)(in_RDI + 0x108),(ulong)local_3c);
      iVar1 = Imath_2_5::modp(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
      if (iVar1 == 0) {
        puVar3 = Array::operator_cast_to_unsigned_int_((Array *)(in_RDI + 0x158));
        in_stack_ffffffffffffffb4 = puVar3[local_2c - *(int *)(in_RDI + 0xc4)];
        convertInPlace((char **)in_RSI,(char **)CONCAT44(iVar4,in_ECX),in_R8D,(size_t)numPixels);
      }
    }
  }
  return;
}

Assistant:

void
convertToXdr (DeepScanLineOutputFile::Data *ofd,
              Array<char> &lineBuffer,
              int lineBufferMinY,
              int lineBufferMaxY,
              int inSize)
{
    //
    // Convert the contents of a lineBuffer from the machine's native
    // representation to Xdr format.  This function is called by
    // CompressLineBuffer::execute(), below, if the compressor wanted
    // its input pixel data in the machine's native format, but then
    // failed to compress the data (most compressors will expand rather
    // than compress random input data).
    //
    // Note that this routine assumes that the machine's native
    // representation of the pixel data has the same size as the
    // Xdr representation.  This makes it possible to convert the
    // pixel data in place, without an intermediate temporary buffer.
    //

    //
    // Iterate over all scanlines in the lineBuffer to convert.
    //

    char* writePtr = &lineBuffer[0];
    for (int y = lineBufferMinY; y <= lineBufferMaxY; y++)
    {
        //
        // Set these to point to the start of line y.
        // We will write to writePtr from readPtr.
        //

        const char *readPtr = writePtr;

        //
        // Iterate over all slices in the file.
        //

        for (unsigned int i = 0; i < ofd->slices.size(); ++i)
        {
            //
            // Test if scan line y of this channel is
            // contains any data (the scan line contains
            // data only if y % ySampling == 0).
            //

            const OutSliceInfo &slice = *ofd->slices[i];

            if (modp (y, slice.ySampling) != 0)
                continue;

            //
            // Find the number of sampled pixels, dMaxX-dMinX+1, for
            // slice i in scan line y (i.e. pixels within the data window
            // for which x % xSampling == 0).
            //

            int xSampleCount = ofd->lineSampleCount[y - ofd->minY];

            //
            // Convert the samples in place.
            //

            convertInPlace (writePtr, readPtr, slice.type, xSampleCount);
        }
    }
}